

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall
vec<vec<WatchElem>_>::growTo(vec<vec<WatchElem>_> *this,uint size,vec<WatchElem> *pad)

{
  undefined8 *puVar1;
  uint uVar2;
  WatchElem *pWVar3;
  long lVar4;
  long lVar5;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = this->sz;
    if (uVar2 < size) {
      lVar5 = (ulong)size - (ulong)uVar2;
      lVar4 = (ulong)uVar2 << 4;
      do {
        pWVar3 = pad->data;
        puVar1 = (undefined8 *)((long)&this->data->sz + lVar4);
        *puVar1 = *(undefined8 *)pad;
        puVar1[1] = pWVar3;
        lVar4 = lVar4 + 0x10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size, const T& pad) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T(pad);
		}
		sz = size;
	}